

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>::
     format<std::__cxx11::string_const,long_const&,Hex::Hexdumper<unsigned_char>const&>
               (ostream *os,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,long *args,
               Hexdumper<unsigned_char> *args_1)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  runtime_error *this;
  bool local_d2;
  bool local_ba;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char local_5e;
  byte local_5d;
  int local_5c;
  char type;
  bool haveprecision;
  int precision;
  bool havewidth;
  char *pcStack_50;
  int width;
  char *q;
  char padchar;
  bool forcesign;
  char *pcStack_40;
  bool leftadjust;
  char *p;
  Hexdumper<unsigned_char> *pHStack_30;
  bool used_value;
  Hexdumper<unsigned_char> *args_local_1;
  long *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *fmt_local;
  ostream *os_local;
  
  p._7_1_ = 0;
  pcStack_40 = fmt;
  pHStack_30 = args_1;
  args_local_1 = (Hexdumper<unsigned_char> *)args;
  args_local = (long *)value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt;
  fmt_local = (char *)os;
  while( true ) {
    while( true ) {
      if (*pcStack_40 == '\0') {
        if ((p._7_1_ & 1) != 0) {
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*pcStack_40 == '%') break;
      cVar1 = *pcStack_40;
      pcStack_40 = pcStack_40 + 1;
      std::operator<<((ostream *)fmt_local,cVar1);
    }
    pcVar3 = pcStack_40 + 1;
    if (*pcVar3 != '%') break;
    pcStack_40 = pcStack_40 + 2;
    std::operator<<((ostream *)fmt_local,*pcVar3);
  }
  q._7_1_ = *pcVar3 == '-';
  if ((bool)q._7_1_) {
    pcVar3 = pcStack_40 + 2;
  }
  pcStack_40 = pcVar3;
  q._6_1_ = 0;
  if (*pcStack_40 == '+') {
    pcStack_40 = pcStack_40 + 1;
    q._6_1_ = 1;
  }
  else if (*pcStack_40 == ' ') {
    pcStack_40 = pcStack_40 + 1;
  }
  q._5_1_ = 0x20;
  if (*pcStack_40 == '0') {
    pcStack_40 = pcStack_40 + 1;
    q._5_1_ = 0x30;
  }
  else if (*pcStack_40 == ',') {
    pcStack_40 = pcStack_40 + 1;
    q._5_1_ = 0x2c;
  }
  lVar4 = strtol(pcStack_40,&stack0xffffffffffffffb0,10);
  precision = (int)lVar4;
  haveprecision = pcStack_40 != pcStack_50;
  pcStack_40 = pcStack_50;
  local_5c = 0;
  local_5d = 0;
  if (*pcStack_50 == '.') {
    pcStack_40 = pcStack_50 + 1;
    lVar4 = strtol(pcStack_40,&stack0xffffffffffffffb0,10);
    local_5c = (int)lVar4;
    local_5d = pcStack_40 != pcStack_50;
    pcStack_40 = pcStack_50;
  }
  while (pcVar3 = strchr("qhlLzjt",(int)*pcStack_40), pcVar3 != (char *)0x0) {
    pcStack_40 = pcStack_40 + 1;
  }
  pcVar3 = pcStack_40;
  if ((*pcStack_40 == 'I') &&
     ((pcStack_40[2] == '6' || (pcVar3 = pcStack_40 + 1, pcStack_40[2] == '4')))) {
    pcVar3 = pcStack_40 + 3;
  }
  pcStack_40 = pcVar3;
  local_5e = '\0';
  if (*pcStack_40 != '\0') {
    local_5e = *pcStack_40;
    pcStack_40 = pcStack_40 + 1;
  }
  StringFormatter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_long,_Hex::Hexdumper<unsigned_char>_>
  ::applytype((ostream *)fmt_local,local_5e);
  if ((q._6_1_ & 1) == 0) {
    std::ostream::operator<<(fmt_local,std::noshowpos);
  }
  else {
    std::ostream::operator<<(fmt_local,std::showpos);
  }
  if ((q._7_1_ & 1) == 0) {
    if ((q._6_1_ & 1) != 0) {
      std::ostream::operator<<(fmt_local,std::internal);
    }
  }
  else {
    std::ostream::operator<<(fmt_local,std::left);
  }
  if ((haveprecision & 1U) == 0) {
    std::ios_base::width((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  }
  else {
    std::ios_base::width
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)precision);
    if (((q._7_1_ & 1) == 0) && ((q._6_1_ & 1) == 0)) {
      std::ostream::operator<<(fmt_local,std::right);
    }
  }
  if ((local_5d & 1) != 0) {
    std::ios_base::precision
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)local_5c);
  }
  std::ios::fill((char)fmt_local + (char)*(undefined8 *)(*(long *)fmt_local + -0x18));
  if ((((local_5e != 'c') ||
       (bVar2 = output_wchar<std::__cxx11::string>
                          ((ostream *)fmt_local,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_local), !bVar2)) &&
      ((local_5e != 'p' ||
       (bVar2 = output_pointer<std::__cxx11::string>
                          ((ostream *)fmt_local,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_local), !bVar2)))) &&
     ((local_5e != 'b' ||
      (bVar2 = output_hex_data<std::__cxx11::string>
                         ((ostream *)fmt_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          args_local), !bVar2)))) {
    pcVar5 = strchr("iduoxX",(int)local_5e);
    pcVar3 = fmt_local;
    local_81 = 0;
    local_ba = false;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local);
      local_81 = 1;
      local_ba = output_int<std::__cxx11::string>((ostream *)pcVar3,&local_80);
    }
    if ((local_81 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    pcVar3 = fmt_local;
    if (local_ba == false) {
      local_d2 = false;
      if (local_5e == 's') {
        std::__cxx11::string::string
                  ((string *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local);
        local_d2 = output_null<std::__cxx11::string>((ostream *)pcVar3,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      if ((local_d2 == false) &&
         (bVar2 = output_using_operator<std::__cxx11::string>
                            ((ostream *)fmt_local,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_local), !bVar2)) {
        std::operator<<((ostream *)fmt_local,"<?>");
      }
    }
  }
  std::ios_base::precision((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  p._7_1_ = 1;
  format<long_const,Hex::Hexdumper<unsigned_char>const&>
            ((ostream *)fmt_local,pcStack_40,(long *)args_local_1,pHStack_30);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }